

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

long __thiscall
duckdb::Interpolator<true>::Interpolate<unsigned_long,long,duckdb::QuantileIndirect<long>>
          (Interpolator<true> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<long> *accessor)

{
  DataChunk *result_00;
  CURSOR *pCVar1;
  duckdb *this_00;
  bool bVar2;
  reference pvVar3;
  undefined1 auVar4 [16];
  long result_1;
  long local_48;
  string local_40;
  
  pCVar1 = accessor->data;
  if (((pCVar1->scan).next_row_index <= lidx) || (lidx < (pCVar1->scan).current_row_index)) {
    result_00 = &pCVar1->page;
    ColumnDataCollection::Seek(pCVar1->inputs,lidx,&pCVar1->scan,result_00);
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&result_00->data,0);
    pCVar1->data = (long *)pvVar3->data;
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&result_00->data,0);
    FlatVector::VerifyFlatVector(pvVar3);
    pCVar1->validity = &pvVar3->validity;
  }
  this_00 = (duckdb *)pCVar1->data[(uint)((int)lidx - (int)(pCVar1->scan).current_row_index)];
  bVar2 = TryCast::Operation<long,long>((int64_t)this_00,&local_48,false);
  if (bVar2) {
    return local_48;
  }
  auVar4 = __cxa_allocate_exception(0x10);
  CastExceptionText<long,long>(&local_40,this_00,auVar4._8_8_);
  InvalidInputException::InvalidInputException(auVar4._0_8_,(string *)&local_40);
  __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
	}